

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O0

BOOL __thiscall
Js::ModuleRoot::GetAccessors
          (ModuleRoot *this,PropertyId propertyId,Var *getter,Var *setter,
          ScriptContext *requestContext)

{
  BOOL BVar1;
  HostObjectBase **ppHVar2;
  HostObjectBase *pHVar3;
  JavascriptLibrary *this_00;
  GlobalObject *this_01;
  GlobalObject *globalObj;
  ScriptContext *requestContext_local;
  Var *setter_local;
  Var *getter_local;
  PropertyId propertyId_local;
  ModuleRoot *this_local;
  
  BVar1 = DynamicObject::GetAccessors((DynamicObject *)this,propertyId,getter,setter,requestContext)
  ;
  if (BVar1 == 0) {
    ppHVar2 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                        ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
    if (*ppHVar2 == (HostObjectBase *)0x0) {
      this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      this_01 = JavascriptLibrary::GetGlobalObject(this_00);
      this_local._4_4_ = GlobalObject::GetAccessors(this_01,propertyId,getter,setter,requestContext)
      ;
    }
    else {
      pHVar3 = Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                         (&(this->super_RootObjectBase).hostObject);
      this_local._4_4_ =
           (**(code **)(*(long *)pHVar3 + 0xa8))(pHVar3,propertyId,getter,setter,requestContext);
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL ModuleRoot::GetAccessors(PropertyId propertyId, _Outptr_result_maybenull_ Var* getter, _Outptr_result_maybenull_ Var* setter, ScriptContext* requestContext)
    {
        if (DynamicObject::GetAccessors(propertyId, getter, setter, requestContext))
        {
            return TRUE;
        }
        if (this->hostObject)
        {
            return this->hostObject->GetAccessors(propertyId, getter, setter, requestContext);
        }

        // Try checking the global object
        GlobalObject* globalObj = this->GetLibrary()->GetGlobalObject();
        return globalObj->GlobalObject::GetAccessors(propertyId, getter, setter, requestContext);
    }